

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void __thiscall cmStateDirectory::ComputeRelativePathTopBinary(cmStateDirectory *this)

{
  bool bVar1;
  reference this_00;
  string *psVar2;
  ulong uVar3;
  PointerType pBVar4;
  cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
  cVar5;
  bool local_1ba;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  cmStateDirectory local_138;
  undefined1 local_110 [8];
  string currentBinary;
  cmStateSnapshot *snp;
  __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  __end1;
  __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
  local_c8;
  cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
  *local_b8;
  cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
  *__range1;
  undefined1 local_88 [8];
  string result;
  undefined1 local_40 [8];
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> snapshots;
  cmStateSnapshot snapshot;
  cmStateDirectory *this_local;
  
  snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->Snapshot_).State;
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::vector
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40,
             (value_type *)
             &snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    cmStateSnapshot::GetBuildsystemDirectoryParent
              ((cmStateSnapshot *)((long)&result.field_2 + 8),
               (cmStateSnapshot *)
               &snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)result.field_2._8_8_;
    bVar1 = cmStateSnapshot::IsValid
                      ((cmStateSnapshot *)
                       &snapshots.
                        super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::push_back
              ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40,
               (value_type *)
               &snapshots.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  this_00 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::front
                      ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&__range1,this_00);
  psVar2 = GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&__range1);
  std::__cxx11::string::string((string *)local_88,(string *)psVar2);
  cVar5 = cmMakeRange<std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                    ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  __begin1 = cVar5.Begin._M_current;
  local_c8 = cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
             ::advance((cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
                        *)&__begin1,1);
  local_b8 = &local_c8;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
           ::begin(local_b8);
  snp = (cmStateSnapshot *)
        cmRange<__gnu_cxx::__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>_>
        ::end(local_b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                *)&snp);
    if (!bVar1) break;
    currentBinary.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
         ::operator*(&__end1);
    cmStateSnapshot::GetDirectory(&local_138,(cmStateSnapshot *)currentBinary.field_2._8_8_);
    psVar2 = GetCurrentBinary_abi_cxx11_(&local_138);
    std::__cxx11::string::string((string *)local_110,(string *)psVar2);
    bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_88,(string *)local_110);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_88,(string *)local_110);
    }
    std::__cxx11::string::~string((string *)local_110);
    __gnu_cxx::
    __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
    ::operator++(&__end1);
  }
  uVar3 = std::__cxx11::string::size();
  local_1ba = true;
  if (1 < uVar3) {
    std::__cxx11::string::substr((ulong)&local_158,(ulong)local_88);
    local_1ba = std::operator!=(&local_158,"//");
    std::__cxx11::string::~string((string *)&local_158);
  }
  if (local_1ba == false) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
    std::__cxx11::string::clear();
  }
  else {
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    std::__cxx11::string::operator=((string *)&pBVar4->RelativePathTopBinary,(string *)local_88);
  }
  std::__cxx11::string::~string((string *)local_88);
  std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector
            ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_40);
  return;
}

Assistant:

void cmStateDirectory::ComputeRelativePathTopBinary()
{
  cmStateSnapshot snapshot = this->Snapshot_;
  std::vector<cmStateSnapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true) {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid()) {
      snapshots.push_back(snapshot);
    } else {
      break;
    }
  }

  std::string result = snapshots.front().GetDirectory().GetCurrentBinary();

  for (cmStateSnapshot const& snp : cmMakeRange(snapshots).advance(1)) {
    std::string currentBinary = snp.GetDirectory().GetCurrentBinary();
    if (cmSystemTools::IsSubDirectory(result, currentBinary)) {
      result = currentBinary;
    }
  }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if (result.size() < 2 || result.substr(0, 2) != "//") {
    this->DirectoryState->RelativePathTopBinary = result;
  } else {
    this->DirectoryState->RelativePathTopBinary.clear();
  }
}